

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O2

void __thiscall QMenu::paintEvent(QMenu *this,QPaintEvent *e)

{
  undefined8 *puVar1;
  short sVar2;
  int iVar3;
  QMenuPrivate *this_00;
  QWidgetData *pQVar4;
  bool bVar5;
  undefined8 uVar6;
  byte bVar7;
  char cVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  QStyle *pQVar16;
  QWidget *pQVar17;
  QPalette *pQVar18;
  int i;
  ulong uVar19;
  State SVar20;
  long lVar21;
  ScrollerTearOffItem *this_01;
  int iVar22;
  long in_FS_OFFSET;
  QRegion adjustedActionReg;
  undefined8 local_208;
  Representation RStack_200;
  Representation RStack_1fc;
  QRegion borderReg;
  QAction *action;
  QRect local_1d8;
  QRect local_1c8;
  QRect local_1b8;
  QRect local_1a8;
  QRegion emptyArea;
  QStylePainter local_188;
  QStyleOptionMenuItem opt;
  QStyleOptionMenuItem local_d0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMenuPrivate **)&(this->super_QWidget).field_0x8;
  QMenuPrivate::updateActionRects(this_00);
  local_188.wstyle = (QStyle *)&DAT_aaaaaaaaaaaaaaaa;
  local_188._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_188.widget = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
  QStylePainter::QStylePainter(&local_188,&this->super_QWidget);
  emptyArea.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
  local_d0.super_QStyleOption._0_16_ = QWidget::rect(&this->super_QWidget);
  QRegion::QRegion(&emptyArea,(QRect *)&local_d0,Rectangle);
  memset(&local_d0,0xaa,0x98);
  QStyleOptionMenuItem::QStyleOptionMenuItem(&local_d0);
  QStyleOption::initFrom(&local_d0.super_QStyleOption,&this->super_QWidget);
  local_d0.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
  super_QFlagsStorage<QStyle::StateFlag>.i = (QFlagsStorageHelper<QStyle::StateFlag,_4>)0x0;
  local_d0.checkType = NotCheckable;
  local_d0.maxIconWidth = 0;
  local_d0.reservedShortcutWidth = 0;
  QStylePainter::drawPrimitive(&local_188,PE_PanelMenu,&local_d0.super_QStyleOption);
  pQVar16 = QWidget::style(&this->super_QWidget);
  iVar9 = (**(code **)(*(long *)pQVar16 + 0xe0))(pQVar16,0x1e,0,this);
  pQVar16 = QWidget::style(&this->super_QWidget);
  iVar10 = (**(code **)(*(long *)pQVar16 + 0xe0))(pQVar16,0x1c,0,this);
  pQVar16 = QWidget::style(&this->super_QWidget);
  iVar11 = (**(code **)(*(long *)pQVar16 + 0xe0))(pQVar16,0x1d,0,this);
  local_1a8.x1.m_i = 0;
  local_1a8.y1.m_i = 0;
  local_1a8.x2.m_i = -1;
  local_1a8.y2.m_i = -1;
  local_1b8.x1.m_i = 0;
  local_1b8.y1.m_i = 0;
  local_1b8.x2.m_i = -1;
  local_1b8.y2.m_i = -1;
  iVar12 = (int)(this_00->super_QWidgetPrivate).leftmargin;
  iVar14 = iVar10 + iVar9 + iVar12;
  iVar22 = (int)(this_00->super_QWidgetPrivate).topmargin + iVar11 + iVar9;
  pQVar4 = (this->super_QWidget).data;
  iVar10 = (((pQVar4->crect).x2.m_i + (iVar10 + iVar9) * -2) -
           (iVar12 + (pQVar4->crect).x1.m_i + (int)(this_00->super_QWidgetPrivate).rightmargin)) + 1
  ;
  if (this_00->scroll != (QMenuScroller *)0x0) {
    sVar2 = (this_00->super_QWidgetPrivate).bottommargin;
    bVar7 = this_00->scroll->scrollFlags;
    if ((bVar7 & 1) != 0) {
      iVar12 = QMenuPrivate::scrollerHeight(this_00);
      local_1a8.x2.m_i = iVar14 + -1 + iVar10;
      local_1a8.y2.m_i = iVar12 + iVar22 + -1;
      bVar7 = this_00->scroll->scrollFlags;
      local_1a8.x1.m_i = iVar14;
      local_1a8.y1.m_i = iVar22;
    }
    if ((bVar7 & 2) != 0) {
      pQVar4 = (this->super_QWidget).data;
      iVar12 = (pQVar4->crect).y2.m_i;
      iVar3 = (pQVar4->crect).y1.m_i;
      iVar13 = QMenuPrivate::scrollerHeight(this_00);
      iVar13 = iVar13 + iVar11 + iVar9 + (int)sVar2 + iVar3;
      iVar11 = QMenuPrivate::scrollerHeight(this_00);
      local_1b8.x2.m_i = iVar14 + iVar10 + -1;
      local_1b8.y2.m_i = iVar11 + (iVar12 - iVar13);
      local_1b8.x1.m_i = iVar14;
      local_1b8.y1.m_i = (iVar12 - iVar13) + 1;
    }
  }
  local_1c8.x1.m_i = 0;
  local_1c8.y1.m_i = 0;
  local_1c8.x2.m_i = -1;
  local_1c8.y2.m_i = -1;
  if ((this_00->field_0x421 & 2) != 0) {
    pQVar16 = QWidget::style(&this->super_QWidget);
    iVar11 = (**(code **)(*(long *)pQVar16 + 0xe0))(pQVar16,0x1f,0,this);
    local_1c8.x2.m_i = iVar14 + -1 + iVar10;
    iVar10 = iVar11 + iVar22 + -1;
    local_1c8.x1.m_i = iVar14;
    local_1c8.y1.m_i = iVar22;
    local_1c8.y2.m_i = iVar10;
    if ((this_00->scroll != (QMenuScroller *)0x0) && ((this_00->scroll->scrollFlags & 1) != 0)) {
      iVar14 = QMenuPrivate::scrollerHeight(this_00);
      local_1c8.y1.m_i = iVar22 + iVar14;
      local_1c8.y2.m_i = iVar10 + iVar14;
    }
  }
  local_1d8 = (QRect)QRect::operator|(&local_1a8,&local_1c8);
  lVar21 = 0;
  for (uVar19 = 0; uVar19 < (ulong)(this_00->super_QWidgetPrivate).actions.d.size;
      uVar19 = uVar19 + 1) {
    action = (this_00->super_QWidgetPrivate).actions.d.ptr[uVar19];
    puVar1 = (undefined8 *)((long)&(((this_00->actionRects).d.ptr)->x1).m_i + lVar21);
    borderReg.d = (QRegionData *)*puVar1;
    uVar6 = puVar1[1];
    cVar8 = QRect::intersects((QRect *)(e + 0x10));
    if (cVar8 != '\0') {
      pQVar17 = QHash<QAction_*,_QWidget_*>::value(&this_00->widgetItems,&action);
      if (pQVar17 == (QWidget *)0x0) {
        QRegion::QRegion((QRegion *)&opt,(QRect *)&borderReg,Rectangle);
        QRegion::operator-=(&emptyArea,(QRegion *)&opt);
        QRegion::~QRegion((QRegion *)&opt);
        local_208 = borderReg.d;
        _RStack_200 = uVar6;
        if (local_1d8.x1.m_i <= local_1d8.x2.m_i) {
          if ((local_1d8.y1.m_i <= local_1d8.y2.m_i) &&
             (RStack_1fc.m_i = SUB84(uVar6,4), bVar5 = RStack_1fc.m_i <= local_1d8.y1.m_i, bVar5))
          goto LAB_004251a7;
        }
        if ((local_1b8.x2.m_i < local_1b8.x1.m_i) ||
           ((local_1b8.y2.m_i < local_1b8.y1.m_i ||
            (local_208._4_4_ = (int)((ulong)borderReg.d >> 0x20),
            bVar5 = local_208._4_4_ < local_1b8.y2.m_i, bVar5)))) {
          cVar8 = QRect::intersects((QRect *)&local_208);
          if (cVar8 != '\0') {
            if (RStack_1fc.m_i <= local_1d8.y2.m_i) goto LAB_004251a7;
            local_208 = (QRegionData *)CONCAT44(local_1d8.y2.m_i + 1,local_208._0_4_);
          }
          cVar8 = QRect::intersects((QRect *)&local_208);
          if (cVar8 != '\0') {
            if (local_1b8.y1.m_i <= local_208._4_4_) goto LAB_004251a7;
            RStack_1fc.m_i = local_1b8.y1.m_i + -1;
          }
          adjustedActionReg.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
          QRegion::QRegion(&adjustedActionReg,(QRect *)&local_208,Rectangle);
          QPainter::setClipRegion((QRegion *)&local_188,(ClipOperation)&adjustedActionReg);
          memset(&opt,0xaa,0x98);
          QStyleOptionMenuItem::QStyleOptionMenuItem(&opt);
          (**(code **)(*(long *)&this->super_QWidget + 0x1a0))(this,&opt,action);
          opt.super_QStyleOption.rect.x2.m_i = (int)uVar6;
          opt.super_QStyleOption.rect.y2.m_i = SUB84(uVar6,4);
          opt.super_QStyleOption.rect._0_8_ = borderReg.d;
          QStylePainter::drawControl(&local_188,CE_MenuItem,&opt.super_QStyleOption);
          QStyleOptionMenuItem::~QStyleOptionMenuItem(&opt);
          QRegion::~QRegion(&adjustedActionReg);
        }
      }
    }
LAB_004251a7:
    lVar21 = lVar21 + 0x10;
  }
  QRegion::QRegion((QRegion *)&opt,&local_1d8,Rectangle);
  QRegion::operator-=(&emptyArea,(QRegion *)&opt);
  QRegion::~QRegion((QRegion *)&opt);
  QRegion::QRegion((QRegion *)&opt,&local_1b8,Rectangle);
  QRegion::operator-=(&emptyArea,(QRegion *)&opt);
  QRegion::~QRegion((QRegion *)&opt);
  if (this_00->scrollUpTearOffItem == (ScrollerTearOffItem *)0x0) {
    this_01 = this_00->scrollDownItem;
    if (this_01 == (ScrollerTearOffItem *)0x0) {
      QMenuPrivate::drawScroller(this_00,&local_188.super_QPainter,ScrollUp,&local_1a8);
      QMenuPrivate::drawScroller(this_00,&local_188.super_QPainter,ScrollDown,&local_1b8);
      QMenuPrivate::drawTearOff(this_00,&local_188.super_QPainter,&local_1c8);
      goto LAB_0042525f;
    }
  }
  else {
    QMenuPrivate::ScrollerTearOffItem::updateScrollerRects(this_00->scrollUpTearOffItem,&local_1d8);
    this_01 = this_00->scrollDownItem;
    if (this_01 == (ScrollerTearOffItem *)0x0) goto LAB_0042525f;
  }
  QMenuPrivate::ScrollerTearOffItem::updateScrollerRects(this_01,&local_1b8);
LAB_0042525f:
  if (iVar9 != 0) {
    borderReg.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
    QRegion::QRegion(&borderReg);
    pQVar4 = (this->super_QWidget).data;
    opt.super_QStyleOption.version = 0;
    opt.super_QStyleOption.type = 0;
    SVar20.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.super_QFlagsStorage<QStyle::StateFlag>.i
         = (QFlagsStorageHelper<QStyle::StateFlag,_4>)(iVar9 + -1);
    opt.super_QStyleOption.direction = (pQVar4->crect).y2.m_i - (pQVar4->crect).y1.m_i;
    opt.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
    super_QFlagsStorage<QStyle::StateFlag>.i =
         SVar20.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
         super_QFlagsStorage<QStyle::StateFlag>.i;
    QRegion::operator+=(&borderReg,(QRect *)&opt);
    pQVar4 = (this->super_QWidget).data;
    opt.super_QStyleOption.version = ((pQVar4->crect).x2.m_i - ((pQVar4->crect).x1.m_i + iVar9)) + 1
    ;
    opt.super_QStyleOption.type = 0;
    opt.super_QStyleOption.direction = (pQVar4->crect).y2.m_i - (pQVar4->crect).y1.m_i;
    opt.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
    super_QFlagsStorage<QStyle::StateFlag>.i =
         (QFlagsStorageHelper<QStyle::StateFlag,_4>)
         (QFlagsStorageHelper<QStyle::StateFlag,_4>)
         (opt.super_QStyleOption.version +
         (int)SVar20.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
              super_QFlagsStorage<QStyle::StateFlag>.i);
    QRegion::operator+=(&borderReg,(QRect *)&opt);
    pQVar4 = (this->super_QWidget).data;
    opt.super_QStyleOption.version = 0;
    opt.super_QStyleOption.type = 0;
    opt.super_QStyleOption.direction =
         (LayoutDirection)
         SVar20.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
         super_QFlagsStorage<QStyle::StateFlag>.i;
    opt.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
    super_QFlagsStorage<QStyle::StateFlag>.i =
         (QFlagsStorageHelper<QStyle::StateFlag,_4>)
         (QFlagsStorageHelper<QStyle::StateFlag,_4>)
         ((pQVar4->crect).x2.m_i - (pQVar4->crect).x1.m_i);
    QRegion::operator+=(&borderReg,(QRect *)&opt);
    pQVar4 = (this->super_QWidget).data;
    uVar15 = ((pQVar4->crect).y2.m_i - ((pQVar4->crect).y1.m_i + iVar9)) + 1;
    opt.super_QStyleOption._0_8_ = (ulong)uVar15 << 0x20;
    opt.super_QStyleOption.direction =
         (int)SVar20.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
              super_QFlagsStorage<QStyle::StateFlag>.i + uVar15;
    opt.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
    super_QFlagsStorage<QStyle::StateFlag>.i =
         (QFlagsStorageHelper<QStyle::StateFlag,_4>)
         (QFlagsStorageHelper<QStyle::StateFlag,_4>)
         ((pQVar4->crect).x2.m_i - (pQVar4->crect).x1.m_i);
    QRegion::operator+=(&borderReg,(QRect *)&opt);
    QPainter::setClipRegion((QRegion *)&local_188,(ClipOperation)&borderReg);
    QRegion::operator-=(&emptyArea,&borderReg);
    opt._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt._72_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOptionFrame::QStyleOptionFrame((QStyleOptionFrame *)&opt);
    opt.super_QStyleOption.rect = QWidget::rect(&this->super_QWidget);
    pQVar18 = QWidget::palette(&this->super_QWidget);
    QPalette::operator=(&opt.super_QStyleOption.palette,pQVar18);
    opt.super_QStyleOption._8_8_ = opt.super_QStyleOption._8_8_ & 0xffffffff00000000;
    pQVar16 = QWidget::style(&this->super_QWidget);
    opt.menuItemType = (**(code **)(*(long *)pQVar16 + 0xe0))(pQVar16,0x1e,&opt,this);
    opt.checkType = NotCheckable;
    QStylePainter::drawPrimitive(&local_188,PE_FrameMenu,&opt.super_QStyleOption);
    QStyleOption::~QStyleOption(&opt.super_QStyleOption);
    QRegion::~QRegion(&borderReg);
  }
  QPainter::setClipRegion((QRegion *)&local_188,(ClipOperation)&emptyArea);
  local_d0.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
  super_QFlagsStorage<QStyle::StateFlag>.i = (QFlagsStorageHelper<QStyle::StateFlag,_4>)0x0;
  local_d0.menuItemType = EmptyArea;
  local_d0.checkType = NotCheckable;
  local_d0.super_QStyleOption.rect = QWidget::rect(&this->super_QWidget);
  local_d0.menuRect = QWidget::rect(&this->super_QWidget);
  QStylePainter::drawControl(&local_188,CE_MenuEmptyArea,&local_d0.super_QStyleOption);
  QStyleOptionMenuItem::~QStyleOptionMenuItem(&local_d0);
  QRegion::~QRegion(&emptyArea);
  QPainter::~QPainter(&local_188.super_QPainter);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMenu::paintEvent(QPaintEvent *e)
{
    Q_D(QMenu);
    d->updateActionRects();
    QStylePainter p(this);
    QRegion emptyArea = QRegion(rect());

    QStyleOptionMenuItem menuOpt;
    menuOpt.initFrom(this);
    menuOpt.state = QStyle::State_None;
    menuOpt.checkType = QStyleOptionMenuItem::NotCheckable;
    menuOpt.maxIconWidth = 0;
    menuOpt.reservedShortcutWidth = 0;
    p.drawPrimitive(QStyle::PE_PanelMenu, menuOpt);

    //calculate the scroll up / down rect
    const int fw = style()->pixelMetric(QStyle::PM_MenuPanelWidth, nullptr, this);
    const int hmargin = style()->pixelMetric(QStyle::PM_MenuHMargin,nullptr, this);
    const int vmargin = style()->pixelMetric(QStyle::PM_MenuVMargin, nullptr, this);

    QRect scrollUpRect, scrollDownRect;
    const int leftmargin = fw + hmargin + d->leftmargin;
    const int topmargin = fw + vmargin + d->topmargin;
    const int bottommargin = fw + vmargin + d->bottommargin;
    const int contentWidth = width() - (fw + hmargin) * 2 - d->leftmargin - d->rightmargin;
    if (d->scroll) {
        if (d->scroll->scrollFlags & QMenuPrivate::QMenuScroller::ScrollUp)
            scrollUpRect.setRect(leftmargin, topmargin, contentWidth, d->scrollerHeight());

        if (d->scroll->scrollFlags & QMenuPrivate::QMenuScroller::ScrollDown)
            scrollDownRect.setRect(leftmargin, height() - d->scrollerHeight() - bottommargin,
                                   contentWidth, d->scrollerHeight());
    }

    //calculate the tear off rect
    QRect tearOffRect;
    if (d->tearoff) {
        tearOffRect.setRect(leftmargin, topmargin, contentWidth,
                            style()->pixelMetric(QStyle::PM_MenuTearoffHeight, nullptr, this));
        if (d->scroll && d->scroll->scrollFlags & QMenuPrivate::QMenuScroller::ScrollUp)
            tearOffRect.translate(0, d->scrollerHeight());
    }

    //draw the items that need updating..
    QRect scrollUpTearOffRect = scrollUpRect.united(tearOffRect);
    for (int i = 0; i < d->actions.size(); ++i) {
        QAction *action = d->actions.at(i);
        QRect actionRect = d->actionRects.at(i);
        if (!e->rect().intersects(actionRect)
            || d->widgetItems.value(action))
           continue;
        //set the clip region to be extra safe (and adjust for the scrollers)
        emptyArea -= QRegion(actionRect);

        QRect adjustedActionRect = actionRect;
        if (!scrollUpTearOffRect.isEmpty() && adjustedActionRect.bottom() <= scrollUpTearOffRect.top())
            continue;

        if (!scrollDownRect.isEmpty() && adjustedActionRect.top() >=  scrollDownRect.bottom())
            continue;

        if (adjustedActionRect.intersects(scrollUpTearOffRect)) {
            if (adjustedActionRect.bottom() <= scrollUpTearOffRect.bottom())
                continue;
            else
                adjustedActionRect.setTop(scrollUpTearOffRect.bottom()+1);
        }

        if (adjustedActionRect.intersects(scrollDownRect)) {
            if (adjustedActionRect.top() >= scrollDownRect.top())
                continue;
            else
                adjustedActionRect.setBottom(scrollDownRect.top()-1);
        }

        QRegion adjustedActionReg(adjustedActionRect);
        p.setClipRegion(adjustedActionReg);

        QStyleOptionMenuItem opt;
        initStyleOption(&opt, action);
        opt.rect = actionRect;
        p.drawControl(QStyle::CE_MenuItem, opt);
    }

    emptyArea -= QRegion(scrollUpTearOffRect);
    emptyArea -= QRegion(scrollDownRect);

    if (d->scrollUpTearOffItem || d->scrollDownItem) {
        if (d->scrollUpTearOffItem)
            d->scrollUpTearOffItem->updateScrollerRects(scrollUpTearOffRect);
        if (d->scrollDownItem)
            d->scrollDownItem->updateScrollerRects(scrollDownRect);
    } else {
        //paint scroll up /down
        d->drawScroller(&p, QMenuPrivate::ScrollerTearOffItem::ScrollUp, scrollUpRect);
        d->drawScroller(&p, QMenuPrivate::ScrollerTearOffItem::ScrollDown, scrollDownRect);
        //paint the tear off..
        d->drawTearOff(&p, tearOffRect);
    }

    //draw border
    if (fw) {
        QRegion borderReg;
        borderReg += QRect(0, 0, fw, height()); //left
        borderReg += QRect(width()-fw, 0, fw, height()); //right
        borderReg += QRect(0, 0, width(), fw); //top
        borderReg += QRect(0, height()-fw, width(), fw); //bottom
        p.setClipRegion(borderReg);
        emptyArea -= borderReg;
        QStyleOptionFrame frame;
        frame.rect = rect();
        frame.palette = palette();
        frame.state = QStyle::State_None;
        frame.lineWidth = style()->pixelMetric(QStyle::PM_MenuPanelWidth, &frame, this);
        frame.midLineWidth = 0;
        p.drawPrimitive(QStyle::PE_FrameMenu, frame);
    }

    //finally the rest of the spaces
    p.setClipRegion(emptyArea);
    menuOpt.state = QStyle::State_None;
    menuOpt.menuItemType = QStyleOptionMenuItem::EmptyArea;
    menuOpt.checkType = QStyleOptionMenuItem::NotCheckable;
    menuOpt.rect = rect();
    menuOpt.menuRect = rect();
    p.drawControl(QStyle::CE_MenuEmptyArea, menuOpt);
}